

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O1

void __thiscall QStringMatcher::setPattern(QStringMatcher *this,QString *pattern)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  QStringView needle;
  
  QArrayDataPointer<char16_t>::operator=(&(this->q_pattern).d,&pattern->d);
  pcVar1 = (this->q_pattern).d.ptr;
  qVar2 = (this->q_pattern).d.size;
  (this->q_sv).m_size = qVar2;
  (this->q_sv).m_data = pcVar1;
  needle.m_data = pcVar1;
  needle.m_size = qVar2;
  bm_init_skiptable(needle,this->q_skiptable,this->q_cs);
  return;
}

Assistant:

void QStringMatcher::setPattern(const QString &pattern)
{
    q_pattern = pattern;
    q_sv = q_pattern;
    updateSkipTable();
}